

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O1

void __thiscall RenX::LadderDatabase::append(LadderDatabase *this,Entry *entry)

{
  Entry *pEVar1;
  
  this->m_entries = this->m_entries + 1;
  if (this->m_head == (Entry *)0x0) {
    this->m_head = entry;
  }
  else {
    pEVar1 = this->m_end;
    pEVar1->next = entry;
    entry->prev = pEVar1;
  }
  this->m_end = entry;
  return;
}

Assistant:

void RenX::LadderDatabase::append(Entry *entry) {
	++m_entries;
	if (m_head == nullptr) {
		m_head = entry;
		m_end = m_head;
		return;
	}
	m_end->next = entry;
	entry->prev = m_end;
	m_end = entry;
}